

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_logger_fct.h
# Opt level: O2

void custlog__on_test_suite_end(fct_logger_i *l,fct_logger_evt_t *e)

{
  fct_ts_t *ts;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  size_t idx;
  long lVar5;
  double dVar6;
  
  ts = e->ts;
  sVar2 = fct_ts__tst_cnt(ts);
  sVar3 = fct_ts__tst_cnt(ts);
  dVar6 = fct_ts__duration(ts);
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x53f
                  ,"size_t fct_ts__chk_cnt(const fct_ts_t *)");
  }
  sVar1 = (ts->test_list).used_itm_num;
  idx = 0;
  lVar5 = 0;
  while( true ) {
    if (sVar1 == idx) {
      printf("on_test_suite_end:\n    -          name: %s\n    -      duration: %f ms\n    -  tests passed: %d\n    -  tests failed: %d\n    -        checks: %lu\n"
             ,dVar6,ts->name,sVar3,(ulong)(uint)((int)sVar2 - (int)sVar3),lVar5);
      return;
    }
    pvVar4 = fct_nlist__at(&ts->test_list,idx);
    if (pvVar4 == (void *)0x0) break;
    lVar5 = lVar5 + *(long *)((long)pvVar4 + 0x10) + *(long *)((long)pvVar4 + 0x28);
    idx = idx + 1;
  }
  __assert_fail("test != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x41b,
                "size_t fct_test__chk_cnt(const fct_test_t *)");
}

Assistant:

static void
custlog__on_test_suite_end(fct_logger_i *l, fct_logger_evt_t const *e)
{
    fct_ts_t const *test_suite = e->ts;
    int test_cnt = fct_ts__tst_cnt(test_suite);
    int passed_test_cnt = fct_ts__tst_cnt(test_suite);
    int failed_test_cnt = test_cnt - passed_test_cnt;
    (void)l;
    printf("on_test_suite_end:\n"
           "    -          name: %s\n"
           "    -      duration: %f ms\n"
           "    -  tests passed: %d\n"
           "    -  tests failed: %d\n"
           "    -        checks: %lu\n",
           fct_ts__name(test_suite),
           fct_ts__duration(test_suite),
           passed_test_cnt,
           failed_test_cnt,
           (unsigned long) fct_ts__chk_cnt(test_suite)
          );
}